

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HPresolve.cpp
# Opt level: O0

Result __thiscall
presolve::HPresolve::removeSlacks(HPresolve *this,HighsPostsolveStack *postsolve_stack)

{
  double dVar1;
  bool bVar2;
  reference pvVar3;
  reference pvVar4;
  reference pvVar5;
  uint *puVar6;
  reference pvVar7;
  reference this_00;
  char *pcVar8;
  int __c;
  HPresolve *in_RSI;
  iterator *rhs_00;
  HPresolve *in_RDI;
  double dVar9;
  double local_value;
  HighsInt local_iCol;
  HighsSliceNonzero *nonzero;
  iterator __end3;
  iterator __begin3;
  HighsTripletTreeSlicePreOrder *__range3;
  double multiplier;
  double coeff;
  double rhs;
  double cost;
  double upper;
  double lower;
  HighsInt iRow;
  HighsInt coliter;
  HighsInt iCol;
  undefined4 in_stack_fffffffffffffe28;
  HighsInt in_stack_fffffffffffffe2c;
  HPresolve *in_stack_fffffffffffffe30;
  int in_stack_fffffffffffffe38;
  int in_stack_fffffffffffffe3c;
  double in_stack_fffffffffffffe58;
  undefined4 in_stack_fffffffffffffe60;
  int in_stack_fffffffffffffe64;
  double local_178;
  double local_168;
  HighsMatrixSlice<HighsTripletTreeSlicePreOrder> *in_stack_ffffffffffffff08;
  HighsInt *in_stack_ffffffffffffff10;
  HighsInt in_stack_ffffffffffffff18;
  HighsInt in_stack_ffffffffffffff1c;
  HighsPostsolveStack *in_stack_ffffffffffffff20;
  iterator local_c0;
  undefined1 local_80 [40];
  undefined1 *local_58;
  double local_50;
  double local_48;
  double local_40;
  value_type local_38;
  value_type local_30;
  value_type local_28;
  int local_1c;
  uint local_18;
  int local_14;
  HPresolve *local_10;
  
  local_10 = in_RSI;
  for (local_14 = 0; local_14 != in_RDI->model->num_col_; local_14 = local_14 + 1) {
    pvVar3 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                       (&in_RDI->colDeleted,(long)local_14);
    if (((*pvVar3 == '\0') &&
        (pvVar4 = std::vector<int,_std::allocator<int>_>::operator[]
                            (&in_RDI->colsize,(long)local_14), *pvVar4 == 1)) &&
       (pvVar5 = std::vector<HighsVarType,_std::allocator<HighsVarType>_>::operator[]
                           (&in_RDI->model->integrality_,(long)local_14), *pvVar5 != kInteger)) {
      puVar6 = (uint *)std::vector<int,_std::allocator<int>_>::operator[]
                                 (&in_RDI->colhead,(long)local_14);
      local_18 = *puVar6;
      pvVar4 = std::vector<int,_std::allocator<int>_>::operator[](&in_RDI->Arow,(long)(int)local_18)
      ;
      local_1c = *pvVar4;
      pvVar7 = std::vector<double,_std::allocator<double>_>::operator[]
                         (&in_RDI->model->row_lower_,(long)local_1c);
      dVar1 = *pvVar7;
      pvVar7 = std::vector<double,_std::allocator<double>_>::operator[]
                         (&in_RDI->model->row_upper_,(long)local_1c);
      if ((dVar1 == *pvVar7) && (!NAN(dVar1) && !NAN(*pvVar7))) {
        pvVar7 = std::vector<double,_std::allocator<double>_>::operator[]
                           (&in_RDI->model->col_lower_,(long)local_14);
        local_28 = *pvVar7;
        pvVar7 = std::vector<double,_std::allocator<double>_>::operator[]
                           (&in_RDI->model->col_upper_,(long)local_14);
        local_30 = *pvVar7;
        pvVar7 = std::vector<double,_std::allocator<double>_>::operator[]
                           (&in_RDI->model->col_cost_,(long)local_14);
        local_38 = *pvVar7;
        pvVar7 = std::vector<double,_std::allocator<double>_>::operator[]
                           (&in_RDI->model->row_lower_,(long)local_1c);
        local_40 = *pvVar7;
        pvVar7 = std::vector<double,_std::allocator<double>_>::operator[]
                           (&in_RDI->Avalue,(long)(int)local_18);
        local_48 = *pvVar7;
        if (local_48 <= 0.0) {
          local_168 = -local_48 * local_28;
        }
        else {
          local_168 = -local_48 * local_30;
        }
        local_168 = local_168 + local_40;
        pvVar7 = std::vector<double,_std::allocator<double>_>::operator[]
                           (&in_RDI->model->row_lower_,(long)local_1c);
        *pvVar7 = local_168;
        if (local_48 <= 0.0) {
          local_178 = -local_48 * local_30;
        }
        else {
          local_178 = -local_48 * local_28;
        }
        local_178 = local_178 + local_40;
        pvVar7 = std::vector<double,_std::allocator<double>_>::operator[]
                           (&in_RDI->model->row_upper_,(long)local_1c);
        *pvVar7 = local_178;
        if ((local_38 != 0.0) || (NAN(local_38))) {
          local_50 = local_38 / local_48;
          getRowVector((HPresolve *)CONCAT44(in_stack_fffffffffffffe64,in_stack_fffffffffffffe60),
                       (HighsInt)((ulong)in_stack_fffffffffffffe58 >> 0x20));
          local_58 = local_80;
          HighsMatrixSlice<HighsTripletTreeSlicePreOrder>::begin
                    ((HighsMatrixSlice<HighsTripletTreeSlicePreOrder> *)
                     CONCAT44(in_stack_fffffffffffffe3c,in_stack_fffffffffffffe38));
          HighsMatrixSlice<HighsTripletTreeSlicePreOrder>::end
                    ((HighsMatrixSlice<HighsTripletTreeSlicePreOrder> *)
                     CONCAT44(in_stack_fffffffffffffe2c,in_stack_fffffffffffffe28));
          while( true ) {
            rhs_00 = (iterator *)&stack0xffffffffffffff00;
            bVar2 = HighsMatrixSlice<HighsTripletTreeSlicePreOrder>::iterator::operator!=
                              (&local_c0,rhs_00);
            if (!bVar2) break;
            this_00 = HighsMatrixSlice<HighsTripletTreeSlicePreOrder>::iterator::operator*
                                (&local_c0);
            pcVar8 = HighsSliceNonzero::index(this_00,(char *)rhs_00,__c);
            in_stack_fffffffffffffe64 = (int)pcVar8;
            dVar9 = HighsSliceNonzero::value(this_00);
            dVar1 = local_50;
            in_stack_fffffffffffffe58 = dVar9;
            pvVar7 = std::vector<double,_std::allocator<double>_>::operator[]
                               (&in_RDI->model->col_cost_,(long)(int)pcVar8);
            *pvVar7 = -dVar1 * dVar9 + *pvVar7;
            HighsMatrixSlice<HighsTripletTreeSlicePreOrder>::iterator::operator++
                      ((iterator *)in_stack_fffffffffffffe30);
          }
          HighsMatrixSlice<HighsTripletTreeSlicePreOrder>::iterator::~iterator((iterator *)0x712347)
          ;
          HighsMatrixSlice<HighsTripletTreeSlicePreOrder>::iterator::~iterator((iterator *)0x712354)
          ;
          in_RDI->model->offset_ = local_50 * local_40 + in_RDI->model->offset_;
        }
        in_stack_fffffffffffffe30 = local_10;
        in_stack_fffffffffffffe38 = local_1c;
        in_stack_fffffffffffffe3c = local_14;
        getRowVector((HPresolve *)CONCAT44(in_stack_fffffffffffffe64,in_stack_fffffffffffffe60),
                     (HighsInt)((ulong)in_stack_fffffffffffffe58 >> 0x20));
        HighsPostsolveStack::slackColSubstitution<HighsTripletTreeSlicePreOrder>
                  (in_stack_ffffffffffffff20,in_stack_ffffffffffffff1c,in_stack_ffffffffffffff18,
                   (double)in_stack_ffffffffffffff10,in_stack_ffffffffffffff08);
        markColDeleted(in_stack_fffffffffffffe30,in_stack_fffffffffffffe2c);
        unlink(in_RDI,(char *)(ulong)local_18);
      }
    }
  }
  return kOk;
}

Assistant:

HPresolve::Result HPresolve::removeSlacks(
    HighsPostsolveStack& postsolve_stack) {
  // SingletonColumns data structure appears not to be retained
  // throughout presolve
  for (HighsInt iCol = 0; iCol != model->num_col_; ++iCol) {
    if (colDeleted[iCol]) continue;
    if (colsize[iCol] != 1) continue;
    if (model->integrality_[iCol] == HighsVarType::kInteger) continue;
    HighsInt coliter = colhead[iCol];
    HighsInt iRow = Arow[coliter];
    assert(Acol[coliter] == iCol);
    assert(!rowDeleted[iRow]);
    if (model->row_lower_[iRow] != model->row_upper_[iRow]) continue;
    double lower = model->col_lower_[iCol];
    double upper = model->col_upper_[iCol];
    double cost = model->col_cost_[iCol];
    double rhs = model->row_lower_[iRow];
    double coeff = Avalue[coliter];
    assert(coeff);
    // Slack is s = (rhs - a^Tx)/coeff
    //
    // Constraint bounds become:
    //
    // For coeff > 0 [rhs - coeff * upper, rhs - coeff * lower]
    //
    // For coeff < 0 [rhs - coeff * lower, rhs - coeff * upper]
    model->row_lower_[iRow] =
        coeff > 0 ? rhs - coeff * upper : rhs - coeff * lower;
    model->row_upper_[iRow] =
        coeff > 0 ? rhs - coeff * lower : rhs - coeff * upper;
    if (cost) {
      // Cost is (cost * rhs / coeff) + (col_cost - (cost/coeff) row_values)^Tx
      double multiplier = cost / coeff;
      for (const HighsSliceNonzero& nonzero : getRowVector(iRow)) {
        HighsInt local_iCol = nonzero.index();
        double local_value = nonzero.value();
        model->col_cost_[local_iCol] -= multiplier * local_value;
      }
      model->offset_ += multiplier * rhs;
    }
    //
    postsolve_stack.slackColSubstitution(iRow, iCol, rhs, getRowVector(iRow));

    markColDeleted(iCol);

    unlink(coliter);
  }
  return Result::kOk;
}